

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildExtensionRange
          (DescriptorBuilder *this,ExtensionRange *proto,Descriptor *parent,ExtensionRange *result)

{
  int iVar1;
  int iVar2;
  
  iVar1 = proto->start_;
  result->start = iVar1;
  iVar2 = proto->end_;
  result->end = iVar2;
  if (iVar1 < 1) {
    AddError(this,*(string **)(parent + 8),&proto->super_Message,NUMBER,
             "Extension numbers must be positive integers.");
    iVar1 = result->start;
    iVar2 = result->end;
  }
  if (iVar1 < iVar2) {
    return;
  }
  AddError(this,*(string **)(parent + 8),&proto->super_Message,NUMBER,
           "Extension range end number must be greater than start number.");
  return;
}

Assistant:

void DescriptorBuilder::BuildExtensionRange(
    const DescriptorProto::ExtensionRange& proto,
    const Descriptor* parent,
    Descriptor::ExtensionRange* result) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension numbers must be positive integers.");
  }

  // Checking of the upper bound of the extension range is deferred until after
  // options interpreting. This allows messages with message_set_wire_format to
  // have extensions beyond FieldDescriptor::kMaxNumber, since the extension
  // numbers are actually used as int32s in the message_set_wire_format.

  if (result->start >= result->end) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension range end number must be greater than start number.");
  }
}